

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void lex_next(Lexer *lxr)

{
  char *__s1;
  byte bVar1;
  bool bVar2;
  int in_EAX;
  int iVar3;
  size_t sVar4;
  uint64_t uVar5;
  int *piVar6;
  ulonglong uVar7;
  Err *err;
  int iVar8;
  int iVar9;
  byte *pbVar10;
  ulong uVar11;
  char *pcVar12;
  long lVar13;
  size_t __n;
  double dVar14;
  undefined1 auVar15 [16];
  char *end;
  int local_38 [2];
  
LAB_00112b65:
  (lxr->tk).line = lxr->line;
  iVar3 = lxr->cursor;
  (lxr->tk).start = iVar3;
  (lxr->tk).field_4.num = 0.0;
  pcVar12 = lxr->code;
  bVar1 = pcVar12[iVar3];
  if (bVar1 < 0x7d) {
    __s1 = pcVar12 + iVar3;
    switch(bVar1) {
    case 0:
      (lxr->tk).type = 0x119;
      (lxr->tk).length = 0;
      return;
    case 1:
    case 2:
    case 3:
    case 4:
    case 5:
    case 6:
    case 7:
    case 8:
    case 0xb:
    case 0xc:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1c:
    case 0x1d:
    case 0x1e:
    case 0x1f:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2c:
    case 0x3a:
    case 0x3b:
    case 0x3f:
    case 0x40:
    case 0x5b:
    case 0x5c:
    case 0x5d:
    case 0x5e:
    case 0x60:
    case 0x7b:
      break;
    case 9:
    case 10:
    case 0xd:
    case 0x20:
      goto switchD_00112b9a_caseD_9;
    case 0x21:
      goto switchD_00112b9a_caseD_21;
    case 0x25:
      goto switchD_00112b9a_caseD_25;
    case 0x26:
      goto switchD_00112b9a_caseD_26;
    case 0x2a:
      goto switchD_00112b9a_caseD_2a;
    case 0x2d:
      goto switchD_00112b9a_caseD_2d;
    case 0x2e:
      if (__s1[1] == '.') {
        iVar8 = 2;
        iVar9 = 0x100;
        goto LAB_00112e8d;
      }
    case 0x2b:
      if (__s1[1] == '=') {
        iVar8 = 2;
        iVar9 = 0x101;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_2d:
      if (__s1[1] == '=') {
        iVar8 = 2;
        iVar9 = 0x102;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_2a:
      if (__s1[1] == '=') {
        iVar8 = 2;
        iVar9 = 0x103;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_2f:
      if (__s1[1] == '=') {
        iVar8 = 2;
        iVar9 = 0x104;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_25:
      if (__s1[1] == '=') {
        iVar8 = 2;
        iVar9 = 0x105;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_3c:
      if (__s1[1] == '=') {
        iVar8 = 2;
        iVar9 = 0x108;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_3e:
      if (__s1[1] == '=') {
        iVar8 = 2;
        iVar9 = 0x109;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_3d:
      if (__s1[1] == '=') {
        iVar8 = 2;
        iVar9 = 0x106;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_21:
      if (__s1[1] == '=') {
        iVar8 = 2;
        iVar9 = 0x107;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_26:
      if (__s1[1] == '&') {
        iVar8 = 2;
        iVar9 = 0x10a;
        goto LAB_00112e8d;
      }
switchD_00112b9a_caseD_7c:
      if (__s1[1] == '|') {
        iVar8 = 2;
        iVar9 = 0x10b;
        goto LAB_00112e8d;
      }
      break;
    case 0x2f:
      goto switchD_00112b9a_caseD_2f;
    case 0x30:
      iVar8 = 10;
      uVar11 = (ulong)((byte)__s1[1] - 0x42);
      bVar2 = true;
      if ((byte)__s1[1] - 0x42 < 0x37) {
        if ((0x100000001U >> (uVar11 & 0x3f) & 1) == 0) {
          if ((0x200000002000U >> (uVar11 & 0x3f) & 1) == 0) {
            bVar2 = true;
            if ((0x40000000400000U >> (uVar11 & 0x3f) & 1) == 0) goto LAB_00112ca1;
            iVar8 = 0x10;
          }
          else {
            iVar8 = 8;
          }
        }
        else {
          iVar8 = 2;
        }
        bVar2 = false;
      }
      goto LAB_00112ca1;
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
      iVar8 = 10;
      bVar2 = true;
LAB_00112ca1:
      local_38[0] = in_EAX;
      if (bVar2) {
        piVar6 = __errno_location();
        *piVar6 = 0;
        iVar3 = lxr->cursor;
        dVar14 = strtod(pcVar12 + iVar3,(char **)local_38);
        if (*piVar6 == 0) {
          (lxr->tk).type = 0x115;
          local_38[0] = local_38[0] - (int)(pcVar12 + iVar3);
          (lxr->tk).length = local_38[0];
          (lxr->tk).field_4.num = dVar14;
          lxr->cursor = lxr->cursor + local_38[0];
          return;
        }
      }
      else {
        if ((iVar8 != 10) && (iVar8 != 0x10)) {
          lxr->cursor = iVar3 + 2;
        }
        piVar6 = __errno_location();
        *piVar6 = 0;
        iVar3 = lxr->cursor;
        uVar7 = strtoull(pcVar12 + iVar3,(char **)local_38,iVar8);
        if (*piVar6 == 0) {
          (lxr->tk).type = 0x115;
          local_38[0] = local_38[0] - (int)(pcVar12 + iVar3);
          auVar15._8_4_ = (int)(uVar7 >> 0x20);
          auVar15._0_8_ = uVar7;
          auVar15._12_4_ = 0x45300000;
          (lxr->tk).length = local_38[0];
          (lxr->tk).field_4.num =
               (auVar15._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar7) - 4503599627370496.0);
          lxr->cursor = lxr->cursor + local_38[0];
          return;
        }
      }
      err = err_new("failed to parse number");
      err->line = (lxr->tk).line;
      err_file(err,lxr->path);
      err_trigger(lxr->vm,err);
      return;
    case 0x3c:
      goto switchD_00112b9a_caseD_3c;
    case 0x3d:
      goto switchD_00112b9a_caseD_3d;
    case 0x3e:
      goto switchD_00112b9a_caseD_3e;
    default:
      iVar8 = iVar3;
      if (((bVar1 == 0x5f) || (0xf5 < (byte)(bVar1 - 0x3a))) ||
         (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5))) {
        pbVar10 = (byte *)(pcVar12 + (long)iVar3 + 1);
        do {
          do {
            iVar8 = iVar8 + 1;
            lxr->cursor = iVar8;
            bVar1 = *pbVar10;
            pbVar10 = pbVar10 + 1;
          } while (bVar1 == 0x5f);
        } while ((0xf5 < (byte)(bVar1 - 0x3a)) || (0xe5 < (byte)((bVar1 & 0xdf) + 0xa5)));
      }
      (lxr->tk).length = iVar8 - iVar3;
      __n = (size_t)(iVar8 - iVar3);
      pcVar12 = "let";
      lVar13 = 0;
      while ((sVar4 = strlen(pcVar12), sVar4 != __n ||
             (iVar3 = strncmp(__s1,pcVar12,__n), iVar3 != 0))) {
        pcVar12 = *(char **)(lex_ident_keywords + lVar13 * 2 + 8);
        lVar13 = lVar13 + 4;
        if (lVar13 == 0x2c) {
          (lxr->tk).type = 0x114;
          uVar5 = hash_string(__s1,__n);
          (lxr->tk).field_4.ident_hash = uVar5;
          return;
        }
      }
      (lxr->tk).type = *(Tk *)((long)&lex_ident_keyword_tks + lVar13);
      return;
    case 0x7c:
      goto switchD_00112b9a_caseD_7c;
    }
  }
  iVar9 = (int)(char)bVar1;
  iVar8 = 1;
LAB_00112e8d:
  (lxr->tk).type = iVar9;
  (lxr->tk).length = iVar8;
  lxr->cursor = iVar3 + iVar8;
  return;
switchD_00112b9a_caseD_9:
  do {
    bVar1 = pcVar12[iVar3];
    if (bVar1 < 0xd) {
      if (bVar1 != 9) {
        if (bVar1 != 10) goto LAB_00112b65;
LAB_00112bcf:
        lxr->line = lxr->line + 1;
      }
    }
    else if (bVar1 != 0x20) {
      if (bVar1 == 0xd) {
        if (pcVar12[(long)iVar3 + 1] == '\n') {
          iVar3 = iVar3 + 1;
          lxr->cursor = iVar3;
        }
        goto LAB_00112bcf;
      }
      goto LAB_00112b65;
    }
    iVar3 = iVar3 + 1;
    lxr->cursor = iVar3;
  } while( true );
}

Assistant:

void lex_next(Lexer *lxr) {
	// Copy across the current line number and start position to the token
	lxr->tk.line = lxr->line;
	lxr->tk.start = lxr->cursor;
	lxr->tk.ident_hash = 0;

	// We use so many case statements in the hope that the compiler is smart
	// enough to convert this switch into a jump table
	switch (lxr->code[lxr->cursor]) {
		// End of file
	case '\0':
		lxr->tk.type = TK_EOF;
		lxr->tk.length = 0;
		return;

		// Whitespace
	case ' ': case '\n': case '\r': case '\t':
		lex_whitespace(lxr);
		lex_next(lxr);
		return;

		// Identifier
	case 'a': case 'b': case 'c': case 'd': case 'e': case 'f': case 'g':
	case 'h': case 'i': case 'j': case 'k': case 'l': case 'm': case 'n':
	case 'o': case 'p': case 'q': case 'r': case 's': case 't': case 'u':
	case 'v': case 'w': case 'x': case 'y': case 'z':
	case 'A': case 'B': case 'C': case 'D': case 'E': case 'F': case 'G':
	case 'H': case 'I': case 'J': case 'K': case 'L': case 'M': case 'N':
	case 'O': case 'P': case 'Q': case 'R': case 'S': case 'T': case 'U':
	case 'V': case 'W': case 'X': case 'Y': case 'Z':
	case '_':
		lex_ident(lxr);
		return;

		// Number
	case '0': case '1': case '2': case '3': case '4': case '5': case '6':
	case '7': case '8': case '9':
		lex_num(lxr);
		return;

		// Multi-character symbols
	MULTI_CHAR_TK('.', '.', TK_CONCAT)

	MULTI_CHAR_TK('+', '=', TK_ADD_ASSIGN)
	MULTI_CHAR_TK('-', '=', TK_SUB_ASSIGN)
	MULTI_CHAR_TK('*', '=', TK_MUL_ASSIGN)
	MULTI_CHAR_TK('/', '=', TK_DIV_ASSIGN)
	MULTI_CHAR_TK('%', '=', TK_MOD_ASSIGN)

	MULTI_CHAR_TK('<', '=', TK_LE)
	MULTI_CHAR_TK('>', '=', TK_GE)
	MULTI_CHAR_TK('=', '=', TK_EQ)
	MULTI_CHAR_TK('!', '=', TK_NEQ)

	MULTI_CHAR_TK('&', '&', TK_AND)
	MULTI_CHAR_TK('|', '|', TK_OR)

		// Single character symbol
	default:
		lxr->tk.type = lxr->code[lxr->cursor];
		lxr->tk.length = 1;
		break;
	}

	// If we reach here, then we haven't updated the cursor position yet
	lxr->cursor += lxr->tk.length;
}